

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_account.c
# Opt level: O0

int generateDeviceName(char *prefix,char **deviceName)

{
  UNIQUEID_RESULT UVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  size_t sVar4;
  char *pcVar5;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  size_t len;
  LOGGER_LOG l;
  char deviceGuid [37];
  int result;
  char **deviceName_local;
  char *prefix_local;
  
  UVar1 = UniqueId_Generate((char *)&l,0x25);
  if (UVar1 == UNIQUEID_OK) {
    sVar4 = strlen(prefix);
    pcVar5 = (char *)malloc(sVar4 + 0x26);
    *deviceName = pcVar5;
    if (*deviceName == (char *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                  ,"generateDeviceName",0x7b,1,"Failure allocating device ID.\r\n");
      }
      stack0xffffffffffffffe4 = 0x7c;
    }
    else {
      iVar2 = sprintf_s(*deviceName,sVar4 + 0x26,prefix,&l);
      if (iVar2 < 1) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                    ,"generateDeviceName",0x82,1,"Failure constructing device ID.\r\n");
        }
        free(*deviceName);
        stack0xffffffffffffffe4 = 0x84;
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_INFO,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                    ,"generateDeviceName",0x88,1,"Created Device %s.",*deviceName);
        }
        stack0xffffffffffffffe4 = 0;
      }
    }
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                ,"generateDeviceName",0x72,1,"Unable to generate unique Id.\r\n");
    }
    stack0xffffffffffffffe4 = 0x73;
  }
  return stack0xffffffffffffffe4;
}

Assistant:

static int generateDeviceName(const char* prefix, char** deviceName)
{
    int result;
    char deviceGuid[DEVICE_GUID_SIZE];
    if (UniqueId_Generate(deviceGuid, DEVICE_GUID_SIZE) != UNIQUEID_OK)
    {
        LogError("Unable to generate unique Id.\r\n");
        result = MU_FAILURE;
    }
    else
    {
        size_t len = strlen(prefix) + DEVICE_GUID_SIZE;
        *deviceName = (char*)malloc(len + 1);
        if (*deviceName == NULL)
        {
            LogError("Failure allocating device ID.\r\n");
            result = MU_FAILURE;
        }
        else
        {
            if (sprintf_s(*deviceName, len + 1, prefix, deviceGuid) <= 0)
            {
                LogError("Failure constructing device ID.\r\n");
                free(*deviceName);
                result = MU_FAILURE;
            }
            else
            {
                LogInfo("Created Device %s.", *deviceName);
                result = 0;
            }
        }
    }
    return result;
}